

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O1

void __thiscall QuickImpl::~QuickImpl(QuickImpl *this)

{
  AckThread *pAVar1;
  thread *ptVar2;
  PacketReader *__ptr;
  ProcessThread *pPVar3;
  TaskQueueFactory *pTVar4;
  
  (this->super_Quick)._vptr_Quick = (_func_int **)&PTR_ConnectToServer_0012f888;
  LogWrapper::Close(&g_quic_log);
  (*(((this->_paced_thread)._M_t.
      super___uniq_ptr_impl<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::ProcessThread_*,_std::default_delete<dd::ProcessThread>_>.
      super__Head_base<0UL,_dd::ProcessThread_*,_false>._M_head_impl)->super_TaskQueueBase).
    _vptr_TaskQueueBase[6])();
  AckThread::StopThread
            ((this->_ack_thread_impl)._M_t.
             super___uniq_ptr_impl<AckThread,_std::default_delete<AckThread>_>._M_t.
             super__Tuple_impl<0UL,_AckThread_*,_std::default_delete<AckThread>_>.
             super__Head_base<0UL,_AckThread_*,_false>._M_head_impl);
  std::thread::join();
  pAVar1 = (this->_ack_thread_impl)._M_t.
           super___uniq_ptr_impl<AckThread,_std::default_delete<AckThread>_>._M_t.
           super__Tuple_impl<0UL,_AckThread_*,_std::default_delete<AckThread>_>.
           super__Head_base<0UL,_AckThread_*,_false>._M_head_impl;
  if (pAVar1 != (AckThread *)0x0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AckThread::WaitAckSession>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(pAVar1->_wait_ack_sessions)._M_h);
    pthread_mutex_destroy((pthread_mutex_t *)&pAVar1->_lock);
    operator_delete(pAVar1,0x78);
  }
  (this->_ack_thread_impl)._M_t.super___uniq_ptr_impl<AckThread,_std::default_delete<AckThread>_>.
  _M_t.super__Tuple_impl<0UL,_AckThread_*,_std::default_delete<AckThread>_>.
  super__Head_base<0UL,_AckThread_*,_false>._M_head_impl = (AckThread *)0x0;
  ptVar2 = (this->_ack_thread)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar2 != (thread *)0x0) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar2,8);
  }
  (this->_ack_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
  _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  pthread_mutex_destroy((pthread_mutex_t *)&this->_quick_lock);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->_connections)._M_h);
  std::unique_ptr<UdpSocket,_std::default_delete<UdpSocket>_>::~unique_ptr(&this->_udp_socket);
  __ptr = (this->_packet_reader)._M_t.
          super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>._M_t.
          super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
          super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl;
  if (__ptr != (PacketReader *)0x0) {
    std::default_delete<PacketReader>::operator()
              ((default_delete<PacketReader> *)&this->_packet_reader,__ptr);
  }
  (this->_packet_reader)._M_t.
  super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>._M_t.
  super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
  super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl = (PacketReader *)0x0;
  pPVar3 = (this->_paced_thread)._M_t.
           super___uniq_ptr_impl<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>._M_t.
           super__Tuple_impl<0UL,_dd::ProcessThread_*,_std::default_delete<dd::ProcessThread>_>.
           super__Head_base<0UL,_dd::ProcessThread_*,_false>._M_head_impl;
  if (pPVar3 != (ProcessThread *)0x0) {
    (*(pPVar3->super_TaskQueueBase)._vptr_TaskQueueBase[4])();
  }
  (this->_paced_thread)._M_t.
  super___uniq_ptr_impl<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>._M_t.
  super__Tuple_impl<0UL,_dd::ProcessThread_*,_std::default_delete<dd::ProcessThread>_>.
  super__Head_base<0UL,_dd::ProcessThread_*,_false>._M_head_impl = (ProcessThread *)0x0;
  dd::TaskQueue::~TaskQueue(&this->_task_queue);
  pTVar4 = (this->_task_queue_factory)._M_t.
           super___uniq_ptr_impl<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>.
           _M_t.
           super__Tuple_impl<0UL,_dd::TaskQueueFactory_*,_std::default_delete<dd::TaskQueueFactory>_>
           .super__Head_base<0UL,_dd::TaskQueueFactory_*,_false>._M_head_impl;
  if (pTVar4 != (TaskQueueFactory *)0x0) {
    (*pTVar4->_vptr_TaskQueueFactory[1])();
  }
  (this->_task_queue_factory)._M_t.
  super___uniq_ptr_impl<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>._M_t.
  super__Tuple_impl<0UL,_dd::TaskQueueFactory_*,_std::default_delete<dd::TaskQueueFactory>_>.
  super__Head_base<0UL,_dd::TaskQueueFactory_*,_false>._M_head_impl = (TaskQueueFactory *)0x0;
  return;
}

Assistant:

QuickImpl::~QuickImpl()
{
	g_quic_log.Close();
	_paced_thread->Stop();

	_ack_thread_impl->StopThread();
	_ack_thread->join();
}